

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

char * cmExpandVariablesInString(void *arg,char *source,int escapeQuotes,int atOnly)

{
  char *pcVar1;
  allocator local_61;
  string result;
  string barf;
  
  std::__cxx11::string::string((string *)&barf,source,(allocator *)&result);
  pcVar1 = cmMakefile::ExpandVariablesInString
                     ((cmMakefile *)arg,&barf,escapeQuotes != 0,atOnly != 0,false,(char *)0x0,-1,
                      false,false);
  std::__cxx11::string::string((string *)&result,pcVar1,&local_61);
  pcVar1 = (char *)malloc(result._M_string_length + 1);
  if (result._M_string_length != 0) {
    strcpy(pcVar1,result._M_dataplus._M_p);
  }
  pcVar1[result._M_string_length] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p != &result.field_2) {
    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)barf._M_dataplus._M_p != &barf.field_2) {
    operator_delete(barf._M_dataplus._M_p,barf.field_2._M_allocated_capacity + 1);
  }
  return pcVar1;
}

Assistant:

char CCONV* cmExpandVariablesInString(void* arg, const char* source,
                                      int escapeQuotes, int atOnly)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  std::string barf = source;
  std::string result = mf->ExpandVariablesInString(
    barf, (escapeQuotes ? true : false), (atOnly ? true : false));
  char* res = static_cast<char*>(malloc(result.size() + 1));
  if (!result.empty()) {
    strcpy(res, result.c_str());
  }
  res[result.size()] = '\0';
  return res;
}